

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void anon_unknown.dwarf_5db41::two_product_presplit
               (double a,double b,double bhi,double blo,double *x,double *y)

{
  double dVar1;
  
  *x = b * a;
  dVar1 = GEO::expansion_splitter_ * a - (GEO::expansion_splitter_ * a - a);
  *y = (a - dVar1) * blo - (((b * a - dVar1 * bhi) - bhi * (a - dVar1)) - dVar1 * blo);
  return;
}

Assistant:

inline void two_product_presplit(
        double a, double b, double bhi, double blo, double& x, double& y
    ) {
        x = a * b;
        double ahi;
        double alo;
        split(a, ahi, alo);
        double err1 = x - (ahi * bhi);
        double err2 = err1 - (alo * bhi);
        double err3 = err2 - (ahi * blo);
        y = (alo * blo) - err3;
    }